

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::extAddPairwiseToUI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *in_RDX;
  long lVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  undefined1 local_168 [8];
  LaneArray<4_*_2> lanes;
  LaneArray<4> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_40;
  undefined8 local_30;
  
  getLanes<unsigned_short,8>((LaneArray<8> *)local_168,(wasm *)this,in_RDX);
  lanes._M_elems[7].type.id = 0;
  lVar1 = 0;
  do {
    if ((*(long *)((long)&lanes._M_elems[0].field_0 + lVar1 * 2 + 8) != 2) ||
       (*(long *)((long)&lanes._M_elems[1].field_0 + lVar1 * 2 + 8) != 2)) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    local_40.i32 = (uint)*(ushort *)((long)&lanes._M_elems[0].type.id + lVar1 * 2) +
                   (uint)*(ushort *)(local_168 + lVar1 * 2);
    local_30 = 2;
    this_00 = (anon_union_16_6_1532cd5a_for_Literal_0 *)((long)result._M_elems + lVar1 + -8);
    if (this_00 != &local_40) {
      ~Literal((Literal *)&this_00->func);
      Literal((Literal *)&this_00->func,(Literal *)&local_40.func);
    }
    ~Literal((Literal *)&local_40.func);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  Literal(__return_storage_ptr__,(LaneArray<4> *)&lanes._M_elems[7].type);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)((long)result._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)(local_168 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extAddPairwiseToUI32x4() const {
  return extAddPairwise<4, uint16_t, uint32_t>(*this);
}